

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

void __thiscall glslang::TSymbol::TSymbol(TSymbol *this,TSymbol *copyOf)

{
  char *pcVar1;
  TPoolAllocator *pTVar2;
  TString *pTVar3;
  pool_allocator<char> local_30;
  
  this->_vptr_TSymbol = (_func_int **)&PTR___cxa_pure_virtual_00af63f8;
  pcVar1 = (copyOf->name->_M_dataplus)._M_p;
  pTVar2 = GetThreadPoolAllocator();
  pTVar3 = (TString *)TPoolAllocator::allocate(pTVar2,0x28);
  local_30.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)pTVar3,
             pcVar1,&local_30);
  this->name = pTVar3;
  pcVar1 = (copyOf->mangledName->_M_dataplus)._M_p;
  pTVar2 = GetThreadPoolAllocator();
  pTVar3 = (TString *)TPoolAllocator::allocate(pTVar2,0x28);
  local_30.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)pTVar3,
             pcVar1,&local_30);
  this->mangledName = pTVar3;
  this->uniqueId = copyOf->uniqueId;
  this->writable = true;
  return;
}

Assistant:

TSymbol::TSymbol(const TSymbol& copyOf)
{
    name = NewPoolTString(copyOf.name->c_str());
    mangledName = NewPoolTString(copyOf.mangledName->c_str());
    uniqueId = copyOf.uniqueId;
    writable = true;
}